

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleFootInchArchitectural(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0x86;
  id_00.Data4[1] = 0xc0;
  id_00.Data4[2] = 0xee;
  id_00.Data4[3] = 0x8b;
  id_00.Data4[4] = '6';
  id_00.Data4[5] = '\b';
  id_00.Data4[6] = 0x88;
  id_00.Data4[7] = '>';
  id_00.Data1 = 0x50d6ef1b;
  id_00.Data2 = 0xd1d0;
  id_00.Data3 = 0x408a;
  Internal_DimStyleInit(L"Foot-Inch Architectural",-4,id_00,in_RDI);
  Internal_DimStyleFootInchArchitecturalInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleFootInchArchitectural()
{
  const ON_UUID id =
  { 0x50d6ef1b, 0xd1d0, 0x408a,{ 0x86, 0xc0, 0xee, 0x8b, 0x36, 0x8, 0x88, 0x3e } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Foot-Inch Architectural", -4, id, dimstyle);
  Internal_DimStyleFootInchArchitecturalInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}